

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.c
# Opt level: O0

int use_grease(obj *obj)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  obj *obj_00;
  char *local_170;
  char *local_160;
  int local_12c;
  char local_128 [4];
  int res;
  char buf [256];
  obj *otmp;
  obj *obj_local;
  
  local_12c = 0;
  if (u.uprops[0x29].intrinsic != 0) {
    pcVar2 = Tobjnam(obj,"slip");
    pcVar3 = body_part(3);
    pcVar3 = makeplural(pcVar3);
    pline("%s from your %s.",pcVar2,pcVar3);
    dropx(obj);
    return 1;
  }
  if (obj->spe < '\x01') {
    if ((*(uint *)&obj->field_0x4a >> 4 & 1) == 0) {
      pcVar2 = Tobjnam(obj,"seem");
      pline("%s to be empty.",pcVar2);
    }
    else {
      pcVar2 = Tobjnam(obj,"are");
      pline("%s empty.",pcVar2);
    }
  }
  else {
    if (((((*(uint *)&obj->field_0x4a & 1) != 0) || (u.uprops[0x25].intrinsic != 0)) ||
        (u.uprops[0x25].extrinsic != 0)) && (iVar1 = rn2(2), iVar1 == 0)) {
      consume_obj_charge(obj,'\x01');
      pcVar2 = Tobjnam(obj,"slip");
      pcVar3 = body_part(3);
      pcVar3 = makeplural(pcVar3);
      pline("%s from your %s.",pcVar2,pcVar3);
      dropx(obj);
      return 1;
    }
    obj_00 = getobj("\x14\x15","grease",(obj **)0x0);
    if (obj_00 == (obj *)0x0) {
      return 0;
    }
    if (((obj_00->owornmask & 1U) != 0) && (uarmc != (obj *)0x0)) {
      pcVar2 = xname(uarmc);
      strcpy(local_128,pcVar2);
      pcVar2 = xname(obj_00);
      pline("You need to remove your %s to grease your %s.",local_128,pcVar2);
      return 0;
    }
    if (((obj_00->owornmask & 0x40U) != 0) && ((uarmc != (obj *)0x0 || (uarm != (obj *)0x0)))) {
      if (uarmc == (obj *)0x0) {
        local_160 = "";
      }
      else {
        local_160 = xname(uarmc);
      }
      strcpy(local_128,local_160);
      if ((uarmc != (obj *)0x0) && (uarm != (obj *)0x0)) {
        strcat(local_128," and ");
      }
      if (uarm == (obj *)0x0) {
        local_170 = "";
      }
      else {
        local_170 = xname(uarm);
      }
      strcat(local_128,local_170);
      pcVar2 = xname(obj_00);
      pline("You need to remove your %s to grease your %s.",local_128,pcVar2);
      return 0;
    }
    consume_obj_charge(obj,'\x01');
    local_12c = 1;
    if (obj_00 == &zeroobj) {
      iVar1 = rnd(0xf);
      u.uprops[0x29].intrinsic = iVar1 + u.uprops[0x29].intrinsic;
      pcVar2 = body_part(3);
      pcVar2 = makeplural(pcVar2);
      pline("You coat your %s with grease.",pcVar2);
    }
    else {
      pcVar2 = yname(obj_00);
      pline("You cover %s with a thick layer of grease.",pcVar2);
      *(uint *)&obj_00->field_0x4a = *(uint *)&obj_00->field_0x4a & 0xffefffff | 0x100000;
      if (((*(uint *)&obj->field_0x4a & 1) != 0) && (((youmonst.data)->mflags1 & 0x2000) == 0)) {
        iVar1 = rnd(0xf);
        incr_itimeout(&u.uprops[0x29].intrinsic,(long)iVar1);
        pcVar2 = body_part(6);
        pcVar2 = makeplural(pcVar2);
        pline("Some of the grease gets all over your %s.",pcVar2);
      }
    }
  }
  update_inventory();
  return local_12c;
}

Assistant:

static int use_grease(struct obj *obj)
{
	struct obj *otmp;
	char buf[BUFSZ];
	int res = 0;

	if (Glib) {
	    pline("%s from your %s.", Tobjnam(obj, "slip"),
		  makeplural(body_part(FINGER)));
	    dropx(obj);
	    return 1;
	}

	if (obj->spe > 0) {
		if ((obj->cursed || Fumbling) && !rn2(2)) {
			consume_obj_charge(obj, TRUE);

			pline("%s from your %s.", Tobjnam(obj, "slip"),
			      makeplural(body_part(FINGER)));
			dropx(obj);
			return 1;
		}
		otmp = getobj(lubricables, "grease", NULL);
		if (!otmp) return 0;
		if ((otmp->owornmask & WORN_ARMOR) && uarmc) {
			strcpy(buf, xname(uarmc));
			pline(need_to_remove_outer_armor, buf, xname(otmp));
			return 0;
		}
		if ((otmp->owornmask & WORN_SHIRT) && (uarmc || uarm)) {
			strcpy(buf, uarmc ? xname(uarmc) : "");
			if (uarmc && uarm) strcat(buf, " and ");
			strcat(buf, uarm ? xname(uarm) : "");
			pline(need_to_remove_outer_armor, buf, xname(otmp));
			return 0;
		}
		consume_obj_charge(obj, TRUE);
		res = 1;

		if (otmp != &zeroobj) {
			pline("You cover %s with a thick layer of grease.",
			    yname(otmp));
			otmp->greased = 1;
			if (obj->cursed && !nohands(youmonst.data)) {
			    incr_itimeout(&Glib, rnd(15));
			    pline("Some of the grease gets all over your %s.",
				makeplural(body_part(HAND)));
			}
		} else {
			Glib += rnd(15);
			pline("You coat your %s with grease.",
			    makeplural(body_part(FINGER)));
		}
	} else {
	    if (obj->known)
		pline("%s empty.", Tobjnam(obj, "are"));
	    else
		pline("%s to be empty.", Tobjnam(obj, "seem"));
	}
	update_inventory();
	return res;
}